

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgDisplay * __thiscall cimg_library::CImgDisplay::move(CImgDisplay *this,int posx,int posy)

{
  Display *pDVar1;
  X11_info *pXVar2;
  CImgDisplay *pCVar3;
  
  if ((this->_width != 0) && (this->_height != 0)) {
    show(this);
    pXVar2 = cimg::X11_attr();
    pDVar1 = pXVar2->display;
    XLockDisplay(pDVar1);
    XMoveWindow(pDVar1,this->_window,posx,posy);
    this->_window_x = posx;
    this->_window_y = posy;
    this->_is_moved = false;
    XUnlockDisplay(pDVar1);
    pCVar3 = paint(this,true);
    return pCVar3;
  }
  return this;
}

Assistant:

CImgDisplay& move(const int posx, const int posy) {
      if (is_empty()) return *this;
      show();
      Display *const dpy = cimg::X11_attr().display;
      XLockDisplay(dpy);
      XMoveWindow(dpy,_window,posx,posy);
      _window_x = posx; _window_y = posy;
      _is_moved = false;
      XUnlockDisplay(dpy);
      return paint();
    }